

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_copyCCtx(ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  ZSTD_buffered_policy_e zbuff;
  U32 UVar1;
  void *pvVar2;
  void *pvVar3;
  ZSTD_freeFunction p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  undefined4 uVar10;
  U32 UVar11;
  int iVar12;
  size_t sVar13;
  ZSTD_matchState_t *dstMatchState;
  size_t sVar14;
  ZSTD_matchState_t *srcMatchState;
  ulong pledgedSrcSize_00;
  ZSTD_CCtx_params local_100;
  
  pledgedSrcSize_00 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
  sVar13 = 0xffffffffffffffc4;
  if (srcCCtx->stage == ZSTDcs_init) {
    zbuff = srcCCtx->bufferedPolicy;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    p_Var4 = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = p_Var4;
    memcpy(&local_100,&dstCCtx->requestedParams,0xd0);
    local_100.cParams.windowLog = (srcCCtx->appliedParams).cParams.windowLog;
    local_100.cParams.chainLog = (srcCCtx->appliedParams).cParams.chainLog;
    uVar5 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar6 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar7 = (srcCCtx->appliedParams).cParams.minMatch;
    local_100.cParams.targetLength = (srcCCtx->appliedParams).cParams.targetLength;
    local_100.cParams.strategy = (srcCCtx->appliedParams).cParams.strategy;
    local_100.useRowMatchFinder = (srcCCtx->appliedParams).useRowMatchFinder;
    local_100.cParams.hashLog = uVar5;
    local_100.cParams.searchLog = uVar6;
    local_100.cParams.minMatch = uVar7;
    if (local_100.useRowMatchFinder == ZSTD_ps_auto) {
      __assert_fail("srcCCtx->appliedParams.useRowMatchFinder != ZSTD_ps_auto",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9a5,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    local_100.useBlockSplitter = (srcCCtx->appliedParams).useBlockSplitter;
    if (local_100.useBlockSplitter == ZSTD_ps_auto) {
      __assert_fail("srcCCtx->appliedParams.useBlockSplitter != ZSTD_ps_auto",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9a6,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((srcCCtx->appliedParams).ldmParams.enableLdm == ZSTD_ps_auto) {
      __assert_fail("srcCCtx->appliedParams.ldmParams.enableLdm != ZSTD_ps_auto",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9a7,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    local_100.fParams._0_8_ = ZEXT18(pledgedSrcSize_00 != 0xffffffffffffffff);
    local_100.ldmParams.enableLdm = (srcCCtx->appliedParams).ldmParams.enableLdm;
    local_100.ldmParams.hashLog = (srcCCtx->appliedParams).ldmParams.hashLog;
    local_100.ldmParams.bucketSizeLog = (srcCCtx->appliedParams).ldmParams.bucketSizeLog;
    local_100.ldmParams.minMatchLength = (srcCCtx->appliedParams).ldmParams.minMatchLength;
    local_100.ldmParams.hashRateLog = (srcCCtx->appliedParams).ldmParams.hashRateLog;
    local_100.ldmParams.windowLog = (srcCCtx->appliedParams).ldmParams.windowLog;
    local_100.fParams.noDictIDFlag = 0;
    local_100.maxBlockSize = (srcCCtx->appliedParams).maxBlockSize;
    ZSTD_resetCCtx_internal(dstCCtx,&local_100,pledgedSrcSize_00,0,ZSTDcrp_leaveDirty,zbuff);
    if ((dstCCtx->appliedParams).cParams.windowLog != (srcCCtx->appliedParams).cParams.windowLog) {
      __assert_fail("dstCCtx->appliedParams.cParams.windowLog == srcCCtx->appliedParams.cParams.windowLog"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9b0,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((dstCCtx->appliedParams).cParams.strategy != (srcCCtx->appliedParams).cParams.strategy) {
      __assert_fail("dstCCtx->appliedParams.cParams.strategy == srcCCtx->appliedParams.cParams.strategy"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9b1,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((dstCCtx->appliedParams).cParams.hashLog != (srcCCtx->appliedParams).cParams.hashLog) {
      __assert_fail("dstCCtx->appliedParams.cParams.hashLog == srcCCtx->appliedParams.cParams.hashLog"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9b2,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((dstCCtx->appliedParams).cParams.chainLog != (srcCCtx->appliedParams).cParams.chainLog) {
      __assert_fail("dstCCtx->appliedParams.cParams.chainLog == srcCCtx->appliedParams.cParams.chainLog"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9b3,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((dstCCtx->blockState).matchState.hashLog3 != (srcCCtx->blockState).matchState.hashLog3) {
      __assert_fail("dstCCtx->blockState.matchState.hashLog3 == srcCCtx->blockState.matchState.hashLog3"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x9b4,
                    "size_t ZSTD_copyCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx *, ZSTD_frameParameters, U64, ZSTD_buffered_policy_e)"
                   );
    }
    pvVar2 = (dstCCtx->workspace).objectEnd;
    pvVar3 = (dstCCtx->workspace).tableValidEnd;
    if (pvVar3 < pvVar2) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x222,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if ((dstCCtx->workspace).allocStart < pvVar3) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x223,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    (dstCCtx->workspace).tableValidEnd = pvVar2;
    ZSTD_cwksp_assert_internal_consistency(&dstCCtx->workspace);
    sVar14 = 0;
    iVar12 = ZSTD_allocateChainTable
                       ((srcCCtx->appliedParams).cParams.strategy,
                        (srcCCtx->appliedParams).useRowMatchFinder,0);
    if (iVar12 != 0) {
      sVar14 = 4L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
    }
    UVar1 = (srcCCtx->blockState).matchState.hashLog3;
    memcpy((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable,
           4L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f));
    memcpy((dstCCtx->blockState).matchState.chainTable,(srcCCtx->blockState).matchState.chainTable,
           sVar14);
    sVar14 = 0;
    if (UVar1 != 0) {
      sVar14 = 4L << ((byte)UVar1 & 0x3f);
    }
    memcpy((dstCCtx->blockState).matchState.hashTable3,(srcCCtx->blockState).matchState.hashTable3,
           sVar14);
    pvVar2 = (dstCCtx->workspace).tableValidEnd;
    if (pvVar2 < (dstCCtx->workspace).objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22a,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if ((dstCCtx->workspace).allocStart < pvVar2) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22b,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    pvVar3 = (dstCCtx->workspace).tableEnd;
    if (pvVar2 < pvVar3) {
      (dstCCtx->workspace).tableValidEnd = pvVar3;
    }
    ZSTD_cwksp_assert_internal_consistency(&dstCCtx->workspace);
    uVar10 = *(undefined4 *)&(srcCCtx->blockState).matchState.window.field_0x24;
    (dstCCtx->blockState).matchState.window.nbOverflowCorrections =
         (srcCCtx->blockState).matchState.window.nbOverflowCorrections;
    *(undefined4 *)&(dstCCtx->blockState).matchState.window.field_0x24 = uVar10;
    pBVar8 = (srcCCtx->blockState).matchState.window.nextSrc;
    pBVar9 = (srcCCtx->blockState).matchState.window.base;
    UVar1 = (srcCCtx->blockState).matchState.window.dictLimit;
    UVar11 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.dictBase =
         (srcCCtx->blockState).matchState.window.dictBase;
    (dstCCtx->blockState).matchState.window.dictLimit = UVar1;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar11;
    (dstCCtx->blockState).matchState.window.nextSrc = pBVar8;
    (dstCCtx->blockState).matchState.window.base = pBVar9;
    (dstCCtx->blockState).matchState.nextToUpdate = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;
    memcpy((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x1600);
    sVar13 = 0;
  }
  return sVar13;
}

Assistant:

size_t ZSTD_copyCCtx(ZSTD_CCtx* dstCCtx, const ZSTD_CCtx* srcCCtx, unsigned long long pledgedSrcSize)
{
    ZSTD_frameParameters fParams = { 1 /*content*/, 0 /*checksum*/, 0 /*noDictID*/ };
    ZSTD_buffered_policy_e const zbuff = srcCCtx->bufferedPolicy;
    ZSTD_STATIC_ASSERT((U32)ZSTDb_buffered==1);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    fParams.contentSizeFlag = (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN);

    return ZSTD_copyCCtx_internal(dstCCtx, srcCCtx,
                                fParams, pledgedSrcSize,
                                zbuff);
}